

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O1

lzma_ret lzma_lzma_encoder_reset(lzma_coder_conflict9 *coder,lzma_options_lzma *options)

{
  _Bool _Var1;
  uint32_t bt_i_1;
  lzma_ret lVar2;
  probability (*papVar3) [768];
  probability (*papVar4) [64];
  uint uVar5;
  probability (*papVar6) [16];
  uint32_t bt_i;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  _Var1 = is_options_valid(options);
  lVar2 = LZMA_OPTIONS_ERROR;
  if (_Var1) {
    coder->pos_mask = ~(-1 << ((byte)options->pb & 0x1f));
    coder->literal_context_bits = options->lc;
    coder->literal_pos_mask = ~(-1 << ((byte)options->lp & 0x1f));
    (coder->rc).low = 0;
    (coder->rc).cache_size = 1;
    (coder->rc).range = 0xffffffff;
    (coder->rc).cache = '\0';
    (coder->rc).count = 0;
    (coder->rc).pos = 0;
    coder->state = STATE_LIT_LIT;
    coder->reps[0] = 0;
    coder->reps[1] = 0;
    coder->reps[2] = 0;
    coder->reps[3] = 0;
    uVar5 = options->lp + options->lc;
    if (4 < uVar5) {
      __assert_fail("lc + lp <= LZMA_LCLP_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_common.h"
                    ,0x87,"void literal_init(probability (*)[768], uint32_t, uint32_t)");
    }
    papVar3 = coder->literal;
    uVar7 = 0;
    do {
      lVar8 = 0;
      do {
        (*papVar3)[lVar8] = 0x400;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x300);
      uVar7 = uVar7 + 1;
      papVar3 = papVar3 + 1;
    } while (uVar7 >> ((byte)uVar5 & 0x1f) == 0);
    uVar5 = coder->pos_mask;
    papVar6 = coder->is_rep0_long;
    lVar8 = 0;
    do {
      lVar9 = 0;
      do {
        papVar6[-0xf][lVar9] = 0x400;
        (*papVar6)[lVar9] = 0x400;
        lVar9 = lVar9 + 1;
      } while ((ulong)uVar5 + 1 != lVar9);
      coder->is_rep[lVar8] = 0x400;
      coder->is_rep0[lVar8] = 0x400;
      coder->is_rep1[lVar8] = 0x400;
      coder->is_rep2[lVar8] = 0x400;
      lVar8 = lVar8 + 1;
      papVar6 = papVar6 + 1;
    } while (lVar8 != 0xc);
    lVar8 = 0;
    do {
      coder->pos_special[lVar8] = 0x400;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x72);
    papVar4 = coder->pos_slot;
    lVar8 = 0;
    do {
      lVar9 = 0;
      do {
        (*papVar4)[lVar9] = 0x400;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x40);
      lVar8 = lVar8 + 1;
      papVar4 = papVar4 + 1;
    } while (lVar8 != 4);
    lVar8 = 0;
    do {
      coder->pos_align[lVar8] = 0x400;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x10);
    length_encoder_reset(&coder->match_len_encoder,1 << ((byte)options->pb & 0x1f),coder->fast_mode)
    ;
    length_encoder_reset(&coder->rep_len_encoder,1 << ((byte)options->pb & 0x1f),coder->fast_mode);
    coder->match_price_count = 0x7fffffff;
    coder->align_price_count = 0x7fffffff;
    coder->opts_end_index = 0;
    coder->opts_current_index = 0;
    lVar2 = LZMA_OK;
  }
  return lVar2;
}

Assistant:

extern lzma_ret
lzma_lzma_encoder_reset(lzma_coder *coder, const lzma_options_lzma *options)
{
	size_t i, j;

	if (!is_options_valid(options))
		return LZMA_OPTIONS_ERROR;

	coder->pos_mask = (1U << options->pb) - 1;
	coder->literal_context_bits = options->lc;
	coder->literal_pos_mask = (1U << options->lp) - 1;

	// Range coder
	rc_reset(&coder->rc);

	// State
	coder->state = STATE_LIT_LIT;
	for (i = 0; i < REP_DISTANCES; ++i)
		coder->reps[i] = 0;

	literal_init(coder->literal, options->lc, options->lp);

	// Bit encoders
	for (i = 0; i < STATES; ++i) {
		for (j = 0; j <= coder->pos_mask; ++j) {
			bit_reset(coder->is_match[i][j]);
			bit_reset(coder->is_rep0_long[i][j]);
		}

		bit_reset(coder->is_rep[i]);
		bit_reset(coder->is_rep0[i]);
		bit_reset(coder->is_rep1[i]);
		bit_reset(coder->is_rep2[i]);
	}

	for (i = 0; i < FULL_DISTANCES - END_POS_MODEL_INDEX; ++i)
		bit_reset(coder->pos_special[i]);

	// Bit tree encoders
	for (i = 0; i < LEN_TO_POS_STATES; ++i)
		bittree_reset(coder->pos_slot[i], POS_SLOT_BITS);

	bittree_reset(coder->pos_align, ALIGN_BITS);

	// Length encoders
	length_encoder_reset(&coder->match_len_encoder,
			1U << options->pb, coder->fast_mode);

	length_encoder_reset(&coder->rep_len_encoder,
			1U << options->pb, coder->fast_mode);

	// Price counts are incremented every time appropriate probabilities
	// are changed. price counts are set to zero when the price tables
	// are updated, which is done when the appropriate price counts have
	// big enough value, and lzma_mf.read_ahead == 0 which happens at
	// least every OPTS (a few thousand) possible price count increments.
	//
	// By resetting price counts to UINT32_MAX / 2, we make sure that the
	// price tables will be initialized before they will be used (since
	// the value is definitely big enough), and that it is OK to increment
	// price counts without risk of integer overflow (since UINT32_MAX / 2
	// is small enough). The current code doesn't increment price counts
	// before initializing price tables, but it maybe done in future if
	// we add support for saving the state between LZMA2 chunks.
	coder->match_price_count = UINT32_MAX / 2;
	coder->align_price_count = UINT32_MAX / 2;

	coder->opts_end_index = 0;
	coder->opts_current_index = 0;

	return LZMA_OK;
}